

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labelling.cc
# Opt level: O1

bool labelling::operator==(Label *label1,Label *label2)

{
  pointer __s1;
  pointer piVar1;
  pointer __s2;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  size_t __n;
  ulong uVar8;
  bool bVar9;
  
  if ((label1->vertex).lemon_id != (label2->vertex).lemon_id) {
    return false;
  }
  if ((label1->weight == label2->weight) && (!NAN(label1->weight) && !NAN(label2->weight))) {
    __s1 = (label1->partial_path).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    piVar1 = (label1->partial_path).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)piVar1 - (long)__s1;
    __s2 = (label2->partial_path).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    if ((__n == (long)(label2->partial_path).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__s2) &&
       ((piVar1 == __s1 || (iVar5 = bcmp(__s1,__s2,__n), iVar5 == 0)))) {
      pdVar2 = (label1->resource_consumption).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)(label1->resource_consumption).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar2;
      bVar9 = lVar6 == 0;
      if (bVar9) {
        return bVar9;
      }
      uVar7 = lVar6 >> 3;
      pdVar3 = (label2->resource_consumption).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*pdVar2 != *pdVar3) {
        return bVar9;
      }
      if (NAN(*pdVar2) || NAN(*pdVar3)) {
        return bVar9;
      }
      uVar4 = 1;
      while (uVar8 = uVar4, uVar7 + (uVar7 == 0) != uVar8) {
        if ((pdVar2[uVar8] != pdVar3[uVar8]) ||
           (uVar4 = uVar8 + 1, NAN(pdVar2[uVar8]) || NAN(pdVar3[uVar8]))) break;
      }
      return uVar7 <= uVar8;
    }
  }
  return false;
}

Assistant:

bool operator==(const Label& label1, const Label& label2) {
  if (label1.vertex.lemon_id != label2.vertex.lemon_id)
    return false;
  if (label1.weight != label2.weight)
    return false;
  if (label1.partial_path != label2.partial_path)
    return false;
  /// Check every resource for inequality
  for (int i = 0; i < label1.resource_consumption.size(); i++) {
    if (label1.resource_consumption[i] != label2.resource_consumption[i]) {
      return false;
    }
  }
  return true;
}